

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

void charmap_Pop(void)

{
  CharmapStackEntry *__ptr;
  
  __ptr = charmapStack;
  if (charmapStack != (CharmapStackEntry *)0x0) {
    currentCharmap = charmapStack->charmap;
    charmapStack = charmapStack->next;
    free(__ptr);
    return;
  }
  error("No entries in the charmap stack\n");
  return;
}

Assistant:

void charmap_Pop(void)
{
	if (charmapStack == NULL) {
		error("No entries in the charmap stack\n");
		return;
	}

	struct CharmapStackEntry *top = charmapStack;

	currentCharmap = top->charmap;
	charmapStack = top->next;
	free(top);
}